

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pricing_session.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::PricingSession::Unsubscribe(PricingSession *this,Subject *subject)

{
  logger *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>,_std::_Rb_tree_iterator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>_>
  pVar1;
  string local_40;
  
  this_00 = Log;
  price::subject::Subject::ToString_abi_cxx11_(&local_40,subject);
  spdlog::logger::log<std::__cxx11::string>
            (this_00,(source_loc)ZEXT816(0x1c4d25),info,"unsubscribing from {}",&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pVar1 = std::
          _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>_>
          ::equal_range(&(this->subscriptions_)._M_t,subject);
  std::
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::Subscription>_>_>
  ::_M_erase_aux(&(this->subscriptions_)._M_t,(_Base_ptr)pVar1.first._M_node,
                 (_Base_ptr)pVar1.second._M_node);
  (*(this->pixie_provider_->super_Subscriber)._vptr_Subscriber[2])(this->pixie_provider_,subject);
  return;
}

Assistant:

void PricingSession::Unsubscribe(Subject& subject)
{
    Log->info("unsubscribing from {}", subject.ToString());
    subscriptions_.erase(subject);
    pixie_provider_->Unsubscribe(subject);
}